

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O3

REF_STATUS ref_adj_create(REF_ADJ *ref_adj_ptr)

{
  REF_ADJ_ITEM pRVar1;
  REF_ADJ pRVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  
  pRVar2 = (REF_ADJ)malloc(0x20);
  *ref_adj_ptr = pRVar2;
  if (pRVar2 == (REF_ADJ)0x0) {
    pcVar7 = "malloc *ref_adj_ptr of REF_ADJ_STRUCT NULL";
    uVar6 = 0x1f;
  }
  else {
    pRVar2->nnode = 10;
    pRVar2->nitem = 0x14;
    pRVar3 = (REF_INT *)malloc(0x28);
    pRVar2->first = pRVar3;
    if (pRVar3 == (REF_INT *)0x0) {
      pcVar7 = "malloc ref_adj->first of REF_INT NULL";
      uVar6 = 0x25;
    }
    else {
      pRVar3[4] = -1;
      pRVar3[5] = -1;
      pRVar3[6] = -1;
      pRVar3[7] = -1;
      *pRVar3 = -1;
      pRVar3[1] = -1;
      pRVar3[2] = -1;
      pRVar3[3] = -1;
      pRVar3[8] = -1;
      pRVar3[9] = -1;
      pRVar4 = (REF_ADJ_ITEM)malloc(0xa0);
      pRVar2->item = pRVar4;
      if (pRVar4 != (REF_ADJ_ITEM)0x0) {
        iVar8 = 0;
        iVar9 = 1;
        lVar5 = 0;
        do {
          pRVar1 = pRVar4 + lVar5;
          pRVar1->next = iVar8 + 1;
          pRVar1->ref = -1;
          pRVar1[1].next = iVar9 + 1;
          pRVar1[1].ref = -1;
          lVar5 = lVar5 + 2;
          iVar8 = iVar8 + 2;
          iVar9 = iVar9 + 2;
        } while (lVar5 != 0x14);
        pRVar4[0x13].next = -1;
        pRVar2->blank = 0;
        return 0;
      }
      pcVar7 = "malloc ref_adj->item of REF_ADJ_ITEM_STRUCT NULL";
      uVar6 = 0x28;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",uVar6,
         "ref_adj_create",pcVar7);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_adj_create(REF_ADJ *ref_adj_ptr) {
  REF_ADJ ref_adj;
  REF_INT i;

  ref_malloc(*ref_adj_ptr, 1, REF_ADJ_STRUCT);
  ref_adj = (*ref_adj_ptr);

  ref_adj_nnode(ref_adj) = 10;
  ref_adj_nitem(ref_adj) = 20;

  ref_malloc(ref_adj->first, ref_adj_nnode(ref_adj), REF_INT);
  for (i = 0; i < ref_adj_nnode(ref_adj); i++) ref_adj->first[i] = REF_EMPTY;

  ref_malloc(ref_adj->item, ref_adj_nitem(ref_adj), REF_ADJ_ITEM_STRUCT);
  for (i = 0; i < ref_adj_nitem(ref_adj); i++) {
    ref_adj->item[i].ref = REF_EMPTY;
    ref_adj->item[i].next = i + 1;
  }
  ref_adj->item[ref_adj_nitem(ref_adj) - 1].next = REF_EMPTY;
  ref_adj->blank = 0;

  return REF_SUCCESS;
}